

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionCompiler::invalidExpressionToken(SelectionCompiler *this,string *ident)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  SelectionCompiler *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string local_30 [32];
  
  std::operator+((char *)in_RDI,in_RSI);
  bVar1 = compileError(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

bool invalidExpressionToken(const std::string& ident) {
      return compileError("invalid expression token:" + ident);
    }